

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

float64 vector_maha_precomp(float32 *var,int32 len)

{
  double dVar1;
  int local_24;
  double dStack_20;
  int32 i;
  float64 det;
  int32 len_local;
  float32 *var_local;
  
  dStack_20 = 0.0;
  for (local_24 = 0; local_24 < len; local_24 = local_24 + 1) {
    dVar1 = log((double)(float)var[local_24]);
    dStack_20 = dStack_20 - dVar1;
    var[local_24] = (float32)(1.0 / ((float)var[local_24] * 2.0));
  }
  dVar1 = log(6.283185307179586);
  return (float64)((-dVar1 * (double)len + dStack_20) * 0.5);
}

Assistant:

float64
vector_maha_precomp(float32 * var, int32 len)
{
    float64 det;
    int32 i;

    for (det = (float64) 0.0, i = 0; i < len; i++) {    /* log(1.0/prod(var[i])) */
        det -= (float64) (log(var[i]));
        var[i] = (float32) (1.0 / (var[i] * 2.0));
    }
    det -= log(2.0 * M_PI) * len;

    return (det * 0.5);         /* sqrt */
}